

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O1

pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> __thiscall
Test::Suite::runTestMethod(Suite *this,TestMethod *method)

{
  string *this_00;
  string *psVar1;
  string *__str;
  Output *pOVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  duration<long,_std::ratio<1L,_1000000L>_> dVar9;
  pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> pVar10;
  undefined1 auVar11 [12];
  runtime_error local_48 [16];
  Suite *local_38;
  
  piVar4 = __errno_location();
  *piVar4 = 0;
  this_00 = &this->currentTestMethodName;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (this_00,&method->name);
  __str = &method->argString;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->currentTestMethodArgs,__str);
  this->currentTestSucceeded = true;
  psVar1 = &this->suiteName;
  (*this->output->_vptr_Output[4])(this->output,psVar1,method,__str);
  iVar3 = (*this->_vptr_Suite[7])(this,this_00);
  if ((char)iVar3 == '\0') {
    uVar7 = 0;
    dVar9.__r = 0;
    goto LAB_0011f7e6;
  }
  lVar5 = std::chrono::_V2::steady_clock::now();
  local_38 = this;
  if ((method->functor).super__Function_base._M_manager == (_Manager_type)0x0) {
    auVar11 = std::__throw_bad_function_call();
    if (auVar11._8_4_ == 3) {
      __cxa_begin_catch(auVar11._0_8_);
      this->currentTestSucceeded = false;
      __cxa_end_catch();
      goto LAB_0011f77e;
    }
    uVar8 = __cxa_begin_catch(auVar11._0_8_);
    this->currentTestSucceeded = false;
    pOVar2 = this->output;
    if (auVar11._8_4_ == 2) {
      (*pOVar2->_vptr_Output[6])(pOVar2,psVar1,method,__str,uVar8);
    }
    else {
      std::runtime_error::runtime_error(local_48,"non-exception type thrown");
      (*pOVar2->_vptr_Output[6])(pOVar2,psVar1,method,__str,local_48);
      std::runtime_error::~runtime_error(local_48);
    }
    __cxa_end_catch();
    lVar6 = std::chrono::_V2::steady_clock::now();
    (*this->_vptr_Suite[8])(this,this_00,(ulong)this->currentTestSucceeded);
  }
  else {
    (*(method->functor)._M_invoker)((_Any_data *)&method->functor,&local_38);
LAB_0011f77e:
    lVar6 = std::chrono::_V2::steady_clock::now();
    (*this->_vptr_Suite[8])(this,this_00,(ulong)this->currentTestSucceeded);
    (*this->output->_vptr_Output[5])
              (this->output,psVar1,method,__str,(ulong)this->currentTestSucceeded);
  }
  dVar9.__r = (lVar6 - lVar5) / 1000;
  uVar7 = (ulong)this->currentTestSucceeded;
LAB_0011f7e6:
  pVar10.second.__r = dVar9.__r;
  pVar10._0_8_ = uVar7;
  return pVar10;
}

Assistant:

std::pair<bool, std::chrono::microseconds> Suite::runTestMethod(const TestMethod &method) {
  errno = 0;
  bool exceptionThrown = false;
  currentTestMethodName = method.name;
  currentTestMethodArgs = method.argString;
  currentTestSucceeded = true;
  output->initializeTestMethod(suiteName, method.name, method.argString);
  // run before() before every test
  if (before(currentTestMethodName)) {
    std::chrono::steady_clock::time_point startTime = std::chrono::steady_clock::now();
    try {
      method(static_cast<Suite *>(this));
    } catch (const AssertionFailedException &) {
      currentTestSucceeded = false;
    } catch (const std::exception &e) {
      exceptionThrown = true;
      currentTestSucceeded = false;
      output->printException(suiteName, method.name, method.argString, e);
    } catch (...) {
      exceptionThrown = true;
      currentTestSucceeded = false;
      output->printException(suiteName, method.name, method.argString, std::runtime_error("non-exception type thrown"));
    }
    std::chrono::steady_clock::time_point endTime = std::chrono::steady_clock::now();
    // run after() after every test
    after(currentTestMethodName, currentTestSucceeded);
    if (!exceptionThrown) {
      // we don't need to print twice, that the method has failed
      output->finishTestMethod(suiteName, method.name, method.argString, currentTestSucceeded);
    }
    return std::make_pair(
        currentTestSucceeded, std::chrono::duration_cast<std::chrono::microseconds>(endTime - startTime));
  }
  return std::make_pair(false, std::chrono::microseconds::zero());
}